

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternPainter.cpp
# Opt level: O0

void __thiscall
PatternPainter::drawBackground
          (PatternPainter *this,QPainter *p,PatternLayout *l,int ypos,int rowStart,int rows)

{
  int h;
  int x;
  int w;
  int iVar1;
  const_reference b;
  int local_40;
  int i;
  int _rowWidth;
  int start;
  int rowno;
  int _cellHeight;
  int rows_local;
  int rowStart_local;
  int ypos_local;
  PatternLayout *l_local;
  QPainter *p_local;
  PatternPainter *this_local;
  
  h = CellPainter::cellHeight(&this->super_CellPainter);
  x = PatternLayout::patternStart(l);
  w = PatternLayout::rowWidth(l);
  _rowWidth = rowStart;
  rows_local = ypos;
  for (local_40 = 0; local_40 < rows; local_40 = local_40 + 1) {
    iVar1 = highlightIndex(this,_rowWidth);
    b = std::array<QColor,_3UL>::operator[](&this->mBackgroundColors,(long)iVar1);
    QPainter::fillRect(p,x,rows_local,w,h,b);
    rows_local = h + rows_local;
    _rowWidth = _rowWidth + 1;
  }
  return;
}

Assistant:

void PatternPainter::drawBackground(QPainter &p, PatternLayout const& l, int ypos, int rowStart, int rows) const {
    auto const _cellHeight = cellHeight();

    int rowno = rowStart;
    auto const start = l.patternStart();
    auto const _rowWidth = l.rowWidth();
    for (int i = 0; i < rows; ++i) {
        p.fillRect(start, ypos, _rowWidth, _cellHeight, mBackgroundColors[highlightIndex(rowno)]);
        ypos += _cellHeight;
        ++rowno;
    }
}